

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O0

void __thiscall
Js::ProbeContainer::DispatchAsyncBreak(ProbeContainer *this,InterpreterHaltState *pHaltState)

{
  bool bVar1;
  anon_class_8_1_8991fb9c local_30;
  anon_class_16_2_8f409ebb local_28;
  InterpreterHaltState *local_18;
  InterpreterHaltState *pHaltState_local;
  ProbeContainer *this_local;
  
  local_18 = pHaltState;
  pHaltState_local = (InterpreterHaltState *)this;
  Output::Trace(DebuggerPhase,L"ProbeContainer::DispatchAsyncBreak: start: this=%p, pHaltState=%p\n"
                ,this,pHaltState);
  if ((this->pAsyncHaltCallback != (HaltCallback *)0x0) &&
     (bVar1 = CanDispatchHalt(this,local_18), bVar1)) {
    local_28.pHaltState = &local_18;
    local_30.this = this;
    local_28.this = this;
    TryFinally<Js::ProbeContainer::DispatchAsyncBreak(Js::InterpreterHaltState*)::__0,Js::ProbeContainer::DispatchAsyncBreak(Js::InterpreterHaltState*)::__1>
              (&local_28,&local_30);
    Output::Trace(DebuggerPhase,L"ProbeContainer::DispatchAsyncBreak: end: pHaltState=%p\n",local_18
                 );
  }
  return;
}

Assistant:

void ProbeContainer::DispatchAsyncBreak(InterpreterHaltState* pHaltState)
    {
        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchAsyncBreak: start: this=%p, pHaltState=%p\n"), this, pHaltState);

        if (!this->pAsyncHaltCallback || !CanDispatchHalt(pHaltState))
        {
            return;
        }

        TryFinally([&]()
        {
            InitializeLocation(pHaltState, /* We don't need to match script context, stop at any available script function */ false);
            OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchAsyncBreak: initialized location: pHaltState=%p, pHaltState->IsValid()=%d\n"),
                pHaltState, pHaltState->IsValid());

            if (pHaltState->IsValid())
            {
                // Activate the current haltCallback with asyncStepController.
                debugManager->asyncBreakController.Activate(this->pAsyncHaltCallback);
                if (debugManager->asyncBreakController.IsAtStoppingLocation(pHaltState))
                {
                    OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchAsyncBreak: IsAtStoppingLocation: pHaltState=%p\n"), pHaltState);

                    pHaltState->GetFunction()->CheckAndRegisterFuncToDiag(pScriptContext);

                    debugManager->stepController.Deactivate(pHaltState);
                    debugManager->asyncBreakController.DispatchAndReset(pHaltState);
                }
            }
        },
        [&](bool)
        {
            DestroyLocation();
        });

        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchAsyncBreak: end: pHaltState=%p\n"), pHaltState);
    }